

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CheckProximity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  int iVar2;
  undefined4 extraout_var;
  int flags;
  PClass *pPVar4;
  char *pcVar5;
  int iVar6;
  AActor *self;
  bool bVar7;
  PClass *pPVar3;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003e3398;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e337f:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e3398:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1971,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003e3235;
    pPVar3 = (self->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (self->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar4 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar4) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e3398;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003e337f;
LAB_003e3235:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003e33b7;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003e3388:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e33b7:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1972,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pPVar4 = (PClass *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (pPVar4 == (PClass *)0x0) goto LAB_003e329a;
    pPVar3 = pPVar4;
    if (pPVar4 != AActor::RegistrationInfo.MyClass) {
      do {
        pPVar3 = pPVar3->ParentClass;
        if (pPVar3 == AActor::RegistrationInfo.MyClass) break;
      } while (pPVar3 != (PClass *)0x0);
      if (pPVar3 == (PClass *)0x0) {
        pcVar5 = "classname == NULL || classname->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_003e33b7;
      }
    }
  }
  else {
    if (pPVar4 != (PClass *)0x0) goto LAB_003e3388;
LAB_003e329a:
    pPVar4 = (PClass *)0x0;
  }
  if (numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
LAB_003e33df:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1973,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar5 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003e33df;
  }
  pVVar1 = param + 2;
  if (numparam == 3) {
    param = defaultparam->Array;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e346d:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1974,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = param[3].field_0.i;
LAB_003e3306:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e348c:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1975,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flags = param[4].field_0.i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e346d;
    }
    iVar2 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e3306;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e348c;
    }
    flags = param[4].field_0.i;
    if (numparam != 5) {
      if (param[5].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e33fe;
      }
      goto LAB_003e3320;
    }
    param = defaultparam->Array;
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e33fe:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1976,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e3320:
  iVar6 = 0;
  iVar2 = P_Thing_CheckProximity
                    (self,pPVar4,(pVVar1->field_0).f,iVar2,flags,param[5].field_0.i,false);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1978,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = (uint)(iVar2 != 0);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckProximity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(classname, AActor);
	PARAM_FLOAT(distance);
	PARAM_INT_DEF(count);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	ACTION_RETURN_BOOL(!!P_Thing_CheckProximity(self, classname, distance, count, flags, ptr));
}